

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O3

bool __thiscall
Clasp::mt::SharedLitsClause::updateWatch(SharedLitsClause *this,Solver *s,uint32 pos)

{
  uint uVar1;
  pointer puVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  SharedLiterals *pSVar7;
  uint32 *puVar8;
  uint uVar9;
  
  pSVar7 = (this->super_ClauseHead).field_0.shared_;
  uVar6 = pSVar7->size_type_;
  if (3 < uVar6) {
    uVar1 = (this->super_ClauseHead).head_[pos ^ 1].rep_;
    uVar5 = (ulong)(uVar6 & 0xfffffffc);
    puVar2 = (s->assign_).assign_.ebo_.buf;
    pSVar7 = pSVar7 + 1;
    do {
      puVar8 = &pSVar7->size_type_;
      uVar6 = (pSVar7->refCount_).super___atomic_base<int>._M_i;
      if (((byte)(*(byte *)((long)puVar2 + (ulong)(uVar6 & 0xfffffffc)) & 3) !=
           (byte)(((uVar6 & 2) == 0) + 1U)) && (1 < (uVar6 ^ uVar1))) {
        uVar4 = (uint)(uVar5 >> 2);
        uVar9 = 8;
        if (uVar4 < 8) {
          uVar9 = uVar4;
        }
        (this->super_ClauseHead).head_[pos].rep_ = uVar6;
        bVar3 = true;
        switch(uVar9) {
        case 2:
          goto switchD_001849b6_caseD_2;
        case 3:
          goto switchD_001849b6_caseD_3;
        case 4:
          goto switchD_001849b6_caseD_4;
        case 5:
          goto switchD_001849b6_caseD_5;
        case 6:
          goto switchD_001849b6_caseD_6;
        case 7:
          break;
        case 8:
          uVar6 = *puVar8;
          pSVar7 = (SharedLiterals *)puVar8;
          if (((byte)(*(byte *)((long)puVar2 + (ulong)(uVar6 & 0xfffffffc)) & 3) !=
               (byte)(((uVar6 & 2) == 0) + 1U)) && (1 < (uVar6 ^ uVar1))) goto LAB_00184b68;
          break;
        default:
          goto switchD_001849b6_default;
        }
        uVar6 = pSVar7->size_type_;
        pSVar7 = (SharedLiterals *)&pSVar7->size_type_;
        if (((byte)(*(byte *)((long)puVar2 + (ulong)(uVar6 & 0xfffffffc)) & 3) ==
             (byte)(((uVar6 & 2) == 0) + 1U)) || ((uVar6 ^ uVar1) < 2)) {
switchD_001849b6_caseD_6:
          uVar6 = pSVar7->size_type_;
          pSVar7 = (SharedLiterals *)&pSVar7->size_type_;
          if (((byte)(*(byte *)((long)puVar2 + (ulong)(uVar6 & 0xfffffffc)) & 3) ==
               (byte)(((uVar6 & 2) == 0) + 1U)) || ((uVar6 ^ uVar1) < 2)) {
switchD_001849b6_caseD_5:
            uVar6 = pSVar7->size_type_;
            pSVar7 = (SharedLiterals *)&pSVar7->size_type_;
            if (((byte)(*(byte *)((long)puVar2 + (ulong)(uVar6 & 0xfffffffc)) & 3) ==
                 (byte)(((uVar6 & 2) == 0) + 1U)) || ((uVar6 ^ uVar1) < 2)) {
switchD_001849b6_caseD_4:
              uVar6 = pSVar7->size_type_;
              pSVar7 = (SharedLiterals *)&pSVar7->size_type_;
              if (((byte)(*(byte *)((long)puVar2 + (ulong)(uVar6 & 0xfffffffc)) & 3) ==
                   (byte)(((uVar6 & 2) == 0) + 1U)) || ((uVar6 ^ uVar1) < 2)) {
switchD_001849b6_caseD_3:
                uVar6 = pSVar7->size_type_;
                pSVar7 = (SharedLiterals *)&pSVar7->size_type_;
                if (((byte)(*(byte *)((long)puVar2 + (ulong)(uVar6 & 0xfffffffc)) & 3) ==
                     (byte)(((uVar6 & 2) == 0) + 1U)) || ((uVar6 ^ uVar1) < 2)) {
switchD_001849b6_caseD_2:
                  uVar6 = pSVar7->size_type_;
                  if ((byte)(*(byte *)((long)puVar2 + (ulong)(uVar6 & 0xfffffffc)) & 3) ==
                      (byte)(((uVar6 & 2) == 0) + 1U)) {
                    return true;
                  }
                  if ((uVar1 ^ uVar6) < 2) {
                    return true;
                  }
                }
              }
            }
          }
        }
LAB_00184b68:
        (this->super_ClauseHead).head_[2].rep_ = uVar6;
        return bVar3;
      }
      uVar5 = uVar5 - 4;
      pSVar7 = (SharedLiterals *)puVar8;
    } while (uVar5 != 0);
  }
  bVar3 = false;
switchD_001849b6_default:
  return bVar3;
}

Assistant:

bool SharedLitsClause::updateWatch(Solver& s, uint32 pos) {
	Literal  other = head_[1^pos];
	for (const Literal* r = shared_->begin(), *end = shared_->end(); r != end; ++r) {
		// at this point we know that head_[2] is false, so we only need to check
		// that we do not watch the other watched literal twice!
		if (!s.isFalse(*r) && *r != other) {
			head_[pos] = *r; // replace watch
			// try to replace cache literal
			switch( std::min(static_cast<uint32>(8), static_cast<uint32>(end-r)) ) {
				case 8: if (!s.isFalse(*++r) && *r != other) { head_[2] = *r; return true; } // FALLTHROUGH
				case 7: if (!s.isFalse(*++r) && *r != other) { head_[2] = *r; return true; } // FALLTHROUGH
				case 6: if (!s.isFalse(*++r) && *r != other) { head_[2] = *r; return true; } // FALLTHROUGH
				case 5: if (!s.isFalse(*++r) && *r != other) { head_[2] = *r; return true; } // FALLTHROUGH
				case 4: if (!s.isFalse(*++r) && *r != other) { head_[2] = *r; return true; } // FALLTHROUGH
				case 3: if (!s.isFalse(*++r) && *r != other) { head_[2] = *r; return true; } // FALLTHROUGH
				case 2: if (!s.isFalse(*++r) && *r != other) { head_[2] = *r; return true; } // FALLTHROUGH
				default: return true;
			}
		}
	}
	return false;
}